

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

void __thiscall TypeOpCallother::printRaw(TypeOpCallother *this,ostream *s,PcodeOp *op)

{
  long lVar1;
  char local_40;
  undefined7 uStack_3f;
  long local_38;
  undefined1 local_30 [16];
  
  if (op->output != (Varnode *)0x0) {
    Varnode::printRaw(op->output,s);
    std::__ostream_insert<char,std::char_traits<char>>(s," = ",3);
  }
  (*(this->super_TypeOp)._vptr_TypeOp[0xb])(&local_40,this,op);
  std::__ostream_insert<char,std::char_traits<char>>
            (s,(char *)CONCAT71(uStack_3f,local_40),local_38);
  if ((undefined1 *)CONCAT71(uStack_3f,local_40) != local_30) {
    operator_delete((undefined1 *)CONCAT71(uStack_3f,local_40));
  }
  if (1 < (int)((ulong)((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    local_40 = '(';
    std::__ostream_insert<char,std::char_traits<char>>(s,&local_40,1);
    Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_start[1],s);
    if (2 < (int)((ulong)((long)(op->inrefs).
                                super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(op->inrefs).
                               super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3)) {
      lVar1 = 2;
      do {
        local_40 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(s,&local_40,1);
        Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar1],s);
        lVar1 = lVar1 + 1;
      } while (lVar1 < (int)((ulong)((long)(op->inrefs).
                                           super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(op->inrefs).
                                          super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    local_40 = ')';
    std::__ostream_insert<char,std::char_traits<char>>(s,&local_40,1);
  }
  return;
}

Assistant:

void TypeOpCallother::printRaw(ostream &s,const PcodeOp *op)

{
  if (op->getOut() != (Varnode *)0) {
    op->getOut()->printRaw(s);
    s << " = ";
  }
  s << getOperatorName(op);
  if (op->numInput()>1) {
    s << '(';
    op->getIn(1)->printRaw(s);
    for(int4 i=2;i<op->numInput();++i) {
      s << ',';
      op->getIn(i)->printRaw(s);
    }
    s << ')';
  }
}